

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O3

void __thiscall ON_PostEffect::ON_PostEffect(ON_PostEffect *this,ON_PostEffect *pep)

{
  int iVar1;
  Types TVar2;
  CImpl *pCVar3;
  wchar_t *s;
  undefined4 extraout_var;
  undefined8 extraout_RDX;
  ON_wString local_40;
  undefined8 local_38;
  
  this->_vptr_ON_PostEffect = (_func_int **)&PTR__ON_PostEffect_00818448;
  pCVar3 = (CImpl *)operator_new(0x30);
  (*pep->_vptr_ON_PostEffect[7])(&local_40,pep);
  s = ON_wString::operator_cast_to_wchar_t_(&local_40);
  iVar1 = (*pep->_vptr_ON_PostEffect[6])(pep);
  local_38 = extraout_RDX;
  TVar2 = (*pep->_vptr_ON_PostEffect[5])(pep);
  pCVar3->_collection = (ON_PostEffects *)0x0;
  ON_wString::ON_wString(&pCVar3->_local_name,s);
  pCVar3->_local_node = (ON_XMLNode *)0x0;
  (pCVar3->_id).Data1 = iVar1;
  (pCVar3->_id).Data2 = (short)extraout_var;
  (pCVar3->_id).Data3 = (short)((uint)extraout_var >> 0x10);
  *(undefined8 *)(pCVar3->_id).Data4 = local_38;
  pCVar3->_type = TVar2;
  this->_impl = pCVar3;
  ON_wString::~ON_wString(&local_40);
  (*this->_vptr_ON_PostEffect[2])(this,pep);
  return;
}

Assistant:

ON_PostEffect::ON_PostEffect(const ON_PostEffect& pep)
{
  _impl = new CImpl(nullptr, pep.LocalName(), pep.Id(), pep.Type());
  operator = (pep);
}